

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int __thiscall fmt::v6::system_error::init(system_error *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_2
  in_R8;
  unsigned_long_long in_R9;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args;
  memory_buffer buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  runtime_error local_258 [16];
  v6 local_248 [16];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_238;
  
  this->error_code_ = (int)ctx;
  local_238.super_buffer<char>.ptr_ = local_238.store_;
  local_238.super_buffer<char>.size_ = 0;
  local_238.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_001cbc10;
  local_238.super_buffer<char>.capacity_ = 500;
  args.field_1.values_ = in_R8.values_;
  args.types_ = in_R9;
  vformat<fmt::v6::basic_string_view<char>,char>
            (&local_278,local_248,(basic_string_view<char> *)in_R8.values_,args);
  format_system_error(&local_238.super_buffer<char>,(int)ctx,(string_view)local_278._0_16_);
  std::__cxx11::string::~string((string *)&local_278);
  to_string<char,500ul>(&local_278,(v6 *)&local_238,buf);
  std::runtime_error::runtime_error(local_258,(string *)&local_278);
  std::runtime_error::operator=(&this->super_runtime_error,local_258);
  std::runtime_error::~runtime_error(local_258);
  std::__cxx11::string::~string((string *)&local_278);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&local_238);
  return extraout_EAX;
}

Assistant:

FMT_FUNC void system_error::init(int err_code, string_view format_str,
                                 format_args args) {
  error_code_ = err_code;
  memory_buffer buffer;
  format_system_error(buffer, err_code, vformat(format_str, args));
  std::runtime_error& base = *this;
  base = std::runtime_error(to_string(buffer));
}